

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O2

bool __thiscall QNullTexture::create(QNullTexture *this)

{
  uint uVar1;
  QRhiImplementation *this_00;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  ulong uVar5;
  ulong uVar6;
  int level;
  size_type __n;
  long in_FS_OFFSET;
  QSize local_60;
  QImage local_58;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QRhiTexture).field_0x64 == '\x01') {
    (*(this->super_QRhiTexture).super_QRhiResource._vptr_QRhiResource[3])(this);
  }
  (this->super_QRhiTexture).field_0x64 = 1;
  uVar1 = (this->super_QRhiTexture).m_flags.super_QFlagsStorageHelper<QRhiTexture::Flag,_4>.
          super_QFlagsStorage<QRhiTexture::Flag>.i;
  local_40.wd.m_i = (this->super_QRhiTexture).m_pixelSize.wd.m_i;
  uVar2 = 1;
  if ((uVar1 >> 0xd & 1) == 0) {
    if ((local_40.wd.m_i < 1) || ((this->super_QRhiTexture).m_pixelSize.ht.m_i < 1)) {
      local_40.wd.m_i = 1;
      local_40.ht.m_i = 1;
    }
    else {
      local_40 = (this->super_QRhiTexture).m_pixelSize;
    }
  }
  else {
    if (local_40.wd.m_i < 2) {
      local_40.wd.m_i = uVar2;
    }
    local_40.ht.m_i = 1;
  }
  this_00 = (this->super_QRhiTexture).super_QRhiResource.m_rhi;
  if ((uVar1 & 8) != 0) {
    uVar2 = QRhi::mipLevelsForSize(&local_40);
  }
  if ((uVar1 >> 10 & 1) == 0) {
    if ((uVar1 & 0x1004) == 0x1000) {
      uVar1 = (this->super_QRhiTexture).m_arraySize;
      uVar3 = 0;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
    }
    else {
      uVar3 = ((uVar1 & 4) >> 2) * 5 + 1;
    }
  }
  else {
    uVar1 = (this->super_QRhiTexture).m_depth;
    uVar3 = 1;
    if (1 < (int)uVar1) {
      uVar3 = uVar1;
    }
  }
  if ((this->super_QRhiTexture).m_format == RGBA8) {
    QVarLengthArray<std::array<QImage,_16UL>,_6LL>::resize(&this->image,(ulong)uVar3);
    uVar5 = 0;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar5;
    }
    for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      for (__n = 0; uVar6 != __n; __n = __n + 1) {
        local_60 = QRhi::sizeForMipLevel((int)__n,&local_40);
        QImage::QImage(&local_58,&local_60,Format_RGBA8888_Premultiplied);
        pvVar4 = std::array<QImage,_16UL>::operator[]
                           ((array<QImage,_16UL> *)
                            ((long)(this->image).super_QVLABase<std::array<QImage,_16UL>_>.
                                   super_QVLABaseBase.ptr + uVar5 * 0x180),__n);
        QImage::operator=(pvVar4,&local_58);
        QImage::~QImage(&local_58);
        pvVar4 = std::array<QImage,_16UL>::operator[]
                           ((array<QImage,_16UL> *)
                            ((long)(this->image).super_QVLABase<std::array<QImage,_16UL>_>.
                                   super_QVLABaseBase.ptr + uVar5 * 0x180),__n);
        QImage::fill(pvVar4,yellow);
      }
    }
  }
  this->generation = this->generation + 1;
  QRhiImplementation::registerResource(this_00,(QRhiResource *)this,true);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool QNullTexture::create()
{
    if (valid)
        destroy();

    valid = true;

    QRHI_RES_RHI(QRhiNull);
    const bool isCube = m_flags.testFlag(CubeMap);
    const bool is3D = m_flags.testFlag(ThreeDimensional);
    const bool isArray = m_flags.testFlag(TextureArray);
    const bool hasMipMaps = m_flags.testFlag(MipMapped);
    const bool is1D = m_flags.testFlags(OneDimensional);
    QSize size = is1D ? QSize(qMax(1, m_pixelSize.width()), 1)
                      : (m_pixelSize.isEmpty() ? QSize(1, 1) : m_pixelSize);
    const int mipLevelCount = hasMipMaps ? rhiD->q->mipLevelsForSize(size) : 1;
    const int layerCount = is3D ? qMax(1, m_depth)
                                : (isCube ? 6
                                          : (isArray ? qMax(0, m_arraySize)
                                                     : 1));

    if (m_format == RGBA8) {
        image.resize(layerCount);
        for (int layer = 0; layer < layerCount; ++layer) {
            for (int level = 0; level < mipLevelCount; ++level) {
                image[layer][level] = QImage(rhiD->q->sizeForMipLevel(level, size),
                                             QImage::Format_RGBA8888_Premultiplied);
                image[layer][level].fill(Qt::yellow);
            }
        }
    }

    generation += 1;

    rhiD->registerResource(this);

    return true;
}